

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

int libssh2_sftp_symlink_ex
              (LIBSSH2_SFTP *sftp,char *path,uint path_len,char *target,uint target_len,
              int link_type)

{
  char cVar1;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *pLVar2;
  bool bVar3;
  char *pcVar4;
  size_t sVar5;
  uint uVar6;
  uint32_t uVar7;
  int iVar8;
  uint32_t uVar9;
  ulong uVar10;
  uchar *s;
  size_t data_len;
  char *pcVar11;
  uchar *local_88;
  uchar *local_80;
  uint local_78;
  uint32_t local_74;
  char *local_70;
  size_t local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  char *local_40;
  time_t local_38;
  
  if (sftp == (LIBSSH2_SFTP *)0x0) {
    iVar8 = -0x27;
  }
  else {
    uVar10 = (ulong)target_len;
    local_70 = target;
    local_40 = path;
    local_38 = time((time_t *)0x0);
    iVar8 = target_len + 4;
    if (link_type != 0) {
      iVar8 = 0;
    }
    local_68 = (size_t)(path_len + 0xd + iVar8);
    local_74 = path_len + 9 + iVar8;
    local_48 = (ulong)path_len;
    local_78 = 0x10;
    local_58 = uVar10;
    local_50 = uVar10;
    if (link_type != 2) {
      local_78 = (uint)(byte)((link_type == 0) + 0x13);
    }
    do {
      channel = sftp->channel;
      pLVar2 = channel->session;
      local_80 = (uchar *)0x0;
      pcVar11 = (char *)0x0;
      if (sftp->symlink_state == libssh2_NB_state_idle) {
        sftp->last_errno = 0;
        if ((link_type == 2) || (2 < sftp->version)) {
          local_88 = (uchar *)(*pLVar2->alloc)(local_68,&pLVar2->abstract);
          sftp->symlink_packet = local_88;
          if (local_88 != (uchar *)0x0) {
            _libssh2_store_u32(&local_88,local_74);
            *local_88 = (uchar)local_78;
            uVar7 = sftp->request_id;
            sftp->request_id = uVar7 + 1;
            sftp->symlink_request_id = uVar7;
            local_88 = local_88 + 1;
            _libssh2_store_u32(&local_88,uVar7);
            _libssh2_store_str(&local_88,local_40,local_48);
            if (link_type == 0) {
              _libssh2_store_str(&local_88,local_70,local_50);
            }
            sftp->symlink_state = libssh2_NB_state_created;
            goto LAB_00128cc1;
          }
          uVar7 = 0xfffffffa;
          pcVar11 = "Unable to allocate memory for SYMLINK/READLINK/REALPATH packet";
          local_88 = (uchar *)0x0;
        }
        else {
          uVar7 = 0xffffffe1;
          pcVar11 = "Server does not support SYMLINK or READLINK";
        }
LAB_00128f5a:
        uVar7 = _libssh2_error(pLVar2,uVar7,pcVar11);
      }
      else {
LAB_00128cc1:
        sVar5 = local_68;
        if (sftp->symlink_state != libssh2_NB_state_created) {
LAB_00128e28:
          uVar7 = sftp_packet_requirev
                            (sftp,0x1346b7,(uchar *)(ulong)sftp->symlink_request_id,
                             (uint32_t)&stack0xffffffffffffff68,&local_80,(size_t *)0x9,
                             (size_t)pcVar11);
          if (uVar7 == 0) {
            sftp->symlink_state = libssh2_NB_state_idle;
            cVar1 = *pcVar11;
            uVar7 = _libssh2_ntohu32((uchar *)(pcVar11 + 5));
            if (cVar1 == 'e') {
              (*pLVar2->free)(pcVar11,&pLVar2->abstract);
              if (uVar7 == 0) {
                uVar7 = 0;
                goto LAB_00128f62;
              }
              sftp->last_errno = uVar7;
              uVar7 = 0xffffffe1;
              pcVar11 = "SFTP Protocol Error";
            }
            else if (uVar7 == 0) {
              (*pLVar2->free)(pcVar11,&pLVar2->abstract);
              uVar7 = 0xffffffe1;
              pcVar11 = "Invalid READLINK/REALPATH response, no name entries";
            }
            else {
              if ((uchar *)0xc < local_80) {
                uVar9 = _libssh2_ntohu32((uchar *)(pcVar11 + 9));
                pcVar4 = local_70;
                uVar7 = 0xffffffda;
                if (uVar9 < (uint)local_58) {
                  local_60 = (ulong)uVar9;
                  memcpy(local_70,pcVar11 + 0xd,local_60);
                  pcVar4[local_60] = '\0';
                  uVar7 = uVar9;
                }
                (*pLVar2->free)(pcVar11,&pLVar2->abstract);
                goto LAB_00128f62;
              }
              if (local_80 != (uchar *)0x0) {
                (*pLVar2->free)(pcVar11,&pLVar2->abstract);
              }
              uVar7 = 0xffffffe1;
              pcVar11 = "SFTP stat packet too short";
            }
          }
          else {
            if (uVar7 == 0xffffffdb) goto LAB_00128f62;
            if (uVar7 == 0xffffffda) {
              if (local_80 != (uchar *)0x0) {
                (*pLVar2->free)(pcVar11,&pLVar2->abstract);
              }
              uVar7 = 0xffffffe1;
              pcVar11 = "SFTP symlink packet too short";
            }
            else {
              sftp->symlink_state = libssh2_NB_state_idle;
              pcVar11 = "Error waiting for status message";
            }
          }
          goto LAB_00128f5a;
        }
        bVar3 = false;
        uVar10 = _libssh2_channel_write(channel,0,sftp->symlink_packet,local_68);
        if (uVar10 == 0xffffffffffffffdb) {
          uVar10 = 0xffffffdb;
        }
        else {
          (*pLVar2->free)(sftp->symlink_packet,&pLVar2->abstract);
          sftp->symlink_packet = (uchar *)0x0;
          if (uVar10 == sVar5) {
            sftp->symlink_state = libssh2_NB_state_sent;
            bVar3 = true;
          }
          else {
            sftp->symlink_state = libssh2_NB_state_idle;
            uVar6 = _libssh2_error(pLVar2,-7,"Unable to send SYMLINK/READLINK command");
            uVar10 = (ulong)uVar6;
            bVar3 = false;
          }
        }
        uVar7 = (uint32_t)uVar10;
        if (bVar3) goto LAB_00128e28;
      }
LAB_00128f62:
      if (uVar7 != 0xffffffdb) {
        return uVar7;
      }
      pLVar2 = sftp->channel->session;
      if (pLVar2->api_block_mode == 0) {
        return -0x25;
      }
      iVar8 = _libssh2_wait_socket(pLVar2,local_38);
    } while (iVar8 == 0);
  }
  return iVar8;
}

Assistant:

LIBSSH2_API int
libssh2_sftp_symlink_ex(LIBSSH2_SFTP *sftp, const char *path,
                        unsigned int path_len, char *target,
                        unsigned int target_len, int link_type)
{
    int rc;
    if(!sftp)
        return LIBSSH2_ERROR_BAD_USE;
    BLOCK_ADJUST(rc, sftp->channel->session,
                 sftp_symlink(sftp, path, path_len, target, target_len,
                              link_type));
    return rc;
}